

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceAccessChain
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *use)

{
  bool bVar1;
  IRContext *pIVar2;
  Operand *__args;
  Operand *pOVar3;
  uint32_t uVar4;
  array<signed_char,_4UL> after;
  Constant *this_00;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  pointer pOVar8;
  _Alloc_hider _Var9;
  ulong uVar10;
  OperandList new_operands;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_e8;
  undefined1 local_c8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a8;
  undefined1 local_a0 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  string local_70;
  string local_50;
  
  uVar6 = (use->has_result_id_ & 1) + 1;
  if (use->has_type_id_ == false) {
    uVar6 = (uint)use->has_result_id_;
  }
  pIVar2 = (this->super_Pass).context_;
  if ((int)((ulong)((long)(use->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(use->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar6 < 2)
  {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Variable cannot be replaced: invalid instruction","");
    IRContext::EmitErrorMessage(pIVar2,&local_50,use);
    local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    _Var9._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return false;
    }
  }
  else {
    this_00 = descsroautil::GetAccessChainIndexAsConst(pIVar2,use);
    if (this_00 != (Constant *)0x0) {
      uVar4 = analysis::Constant::GetU32(this_00);
      after._M_elems = (_Type)GetReplacementVariable(this,var,uVar4);
      __args = (use->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pOVar3 = (use->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar1 = use->has_result_id_;
      uVar6 = (bVar1 & 1) + 1;
      if (use->has_type_id_ == false) {
        uVar6 = (uint)bVar1;
      }
      if ((int)((ulong)((long)pOVar3 - (long)__args) >> 4) * -0x55555555 - uVar6 == 2) {
        pIVar2 = (this->super_Pass).context_;
        uVar4 = 0;
        if ((bVar1 & 1U) != 0) {
          uVar4 = Instruction::GetSingleWordOperand(use,(uint)use->has_type_id_);
        }
        IRContext::ReplaceAllUsesWith(pIVar2,uVar4,(uint32_t)after._M_elems);
        IRContext::KillInst((this->super_Pass).context_,use);
        return true;
      }
      local_e8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pOVar3 != __args) {
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_e8,__args);
        pOVar8 = (use->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (1 < (ulong)(((long)(use->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar8 >> 4) *
                       -0x5555555555555555)) {
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          emplace_back<spvtools::opt::Operand&>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_e8,pOVar8 + 1);
          local_c8._24_8_ = local_c8 + 0x10;
          local_c8._0_8_ = &PTR__SmallVector_003e9b28;
          local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_c8._8_8_ = 1;
          local_a0._0_4_ = SPV_OPERAND_TYPE_ID;
          local_a0._8_8_ = &PTR__SmallVector_003e9b28;
          local_a0._16_8_ = 0;
          local_a0._32_8_ = local_a0 + 0x18;
          local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_c8._16_4_ = after._M_elems;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_a0 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_c8);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&local_e8,(Operand *)local_a0);
          local_a0._8_8_ = &PTR__SmallVector_003e9b28;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_78,local_78._M_head_impl);
          }
          local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_c8._0_8_ = &PTR__SmallVector_003e9b28;
          if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a8,local_a8._M_head_impl);
          }
          pOVar8 = (use->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = ((long)(use->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar8 >> 4) *
                  -0x5555555555555555;
          if (4 < (uint)uVar5) {
            uVar10 = 4;
            lVar7 = 0xc0;
            do {
              if (uVar5 <= uVar10) goto LAB_001fbdec;
              std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
              emplace_back<spvtools::opt::Operand&>
                        ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                         &local_e8,
                         (Operand *)((long)((pOVar8->words).buffer + 0xfffffffffffffffa) + lVar7));
              pOVar8 = (use->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(use->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar8 >> 4) *
                      -0x5555555555555555;
              uVar10 = uVar10 + 1;
              lVar7 = lVar7 + 0x30;
            } while ((uint)uVar10 < (uint)uVar5);
          }
          Instruction::ReplaceOperands(use,&local_e8);
          pIVar2 = (this->super_Pass).context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
            analysis::DefUseManager::UpdateDefUse
                      ((pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,use);
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_e8);
          return true;
        }
      }
LAB_001fbdec:
      __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
    }
    pIVar2 = (this->super_Pass).context_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Variable cannot be replaced: invalid index","");
    IRContext::EmitErrorMessage(pIVar2,&local_70,use);
    _Var9._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return false;
    }
  }
  operator_delete(_Var9._M_p,local_70.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool DescriptorScalarReplacement::ReplaceAccessChain(Instruction* var,
                                                     Instruction* use) {
  if (use->NumInOperands() <= 1) {
    context()->EmitErrorMessage(
        "Variable cannot be replaced: invalid instruction", use);
    return false;
  }

  const analysis::Constant* const_index =
      descsroautil::GetAccessChainIndexAsConst(context(), use);
  if (const_index == nullptr) {
    context()->EmitErrorMessage("Variable cannot be replaced: invalid index",
                                use);
    return false;
  }

  uint32_t idx = const_index->GetU32();
  uint32_t replacement_var = GetReplacementVariable(var, idx);

  if (use->NumInOperands() == 2) {
    // We are not indexing into the replacement variable.  We can replaces the
    // access chain with the replacement variable itself.
    context()->ReplaceAllUsesWith(use->result_id(), replacement_var);
    context()->KillInst(use);
    return true;
  }

  // We need to build a new access chain with the replacement variable as the
  // base address.
  Instruction::OperandList new_operands;

  // Same result id and result type.
  new_operands.emplace_back(use->GetOperand(0));
  new_operands.emplace_back(use->GetOperand(1));

  // Use the replacement variable as the base address.
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {replacement_var}});

  // Drop the first index because it is consumed by the replacement, and copy
  // the rest.
  for (uint32_t i = 4; i < use->NumOperands(); i++) {
    new_operands.emplace_back(use->GetOperand(i));
  }

  use->ReplaceOperands(new_operands);
  context()->UpdateDefUse(use);
  return true;
}